

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O2

int nghttp2_bufs_add(nghttp2_bufs *bufs,void *data,size_t len)

{
  nghttp2_buf_chain *pnVar1;
  int iVar2;
  uint8_t *puVar3;
  ulong len_00;
  
  do {
    if (len == 0) {
      return 0;
    }
    while( true ) {
      pnVar1 = bufs->cur;
      puVar3 = (pnVar1->buf).last;
      len_00 = (long)(pnVar1->buf).end - (long)puVar3;
      if (len_00 != 0) break;
      iVar2 = bufs_alloc_chain(bufs);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    if (len <= len_00) {
      len_00 = len;
    }
    puVar3 = nghttp2_cpymem(puVar3,data,len_00);
    (pnVar1->buf).last = puVar3;
    data = (void *)((long)data + len_00);
    len = len - len_00;
  } while( true );
}

Assistant:

int nghttp2_bufs_add(nghttp2_bufs *bufs, const void *data, size_t len) {
  int rv;
  size_t nwrite;
  nghttp2_buf *buf;
  const uint8_t *p;

  p = data;

  while (len) {
    buf = &bufs->cur->buf;

    nwrite = nghttp2_min(nghttp2_buf_avail(buf), len);
    if (nwrite == 0) {
      rv = bufs_alloc_chain(bufs);
      if (rv != 0) {
        return rv;
      }
      continue;
    }

    buf->last = nghttp2_cpymem(buf->last, p, nwrite);
    p += nwrite;
    len -= nwrite;
  }

  return 0;
}